

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derTSIZEDec(size_t *val,octet *der,size_t count,u32 tag)

{
  octet oVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  octet *der_00;
  u32 t;
  size_t len;
  u32 local_3c;
  ulong local_38;
  
  sVar2 = derTDec(&local_3c,der,count);
  if (sVar2 == 0xffffffffffffffff) {
    return 0xffffffffffffffff;
  }
  if (local_3c != tag) {
    return 0xffffffffffffffff;
  }
  der_00 = der + sVar2;
  sVar3 = derLDec(&local_38,der_00,count - sVar2);
  if (9 < local_38 || sVar3 == 0xffffffffffffffff) {
    return 0xffffffffffffffff;
  }
  oVar1 = der_00[sVar3];
  if ((char)oVar1 < '\0') {
    return 0xffffffffffffffff;
  }
  if (local_38 < 2 || oVar1 != '\0') {
    if ((local_38 == 9) && (oVar1 != '\0')) {
      return 0xffffffffffffffff;
    }
    if (local_38 == 0) {
      uVar4 = 0;
      goto LAB_0010dc96;
    }
  }
  else if (-1 < (char)der_00[sVar3 + 1]) {
    return 0xffffffffffffffff;
  }
  uVar5 = 0;
  uVar4 = 0;
  do {
    uVar4 = uVar4 << 8 | (ulong)der_00[uVar5 + sVar3];
    uVar5 = uVar5 + 1;
  } while (local_38 != uVar5);
LAB_0010dc96:
  if (val != (size_t *)0x0) {
    *val = uVar4;
  }
  return sVar3 + sVar2 + local_38;
}

Assistant:

size_t derTSIZEDec(size_t* val, const octet der[], size_t count, u32 tag)
{
	u32 t;
	size_t t_count;
	size_t l_count;
	size_t len;
	// pre
	ASSERT(memIsNullOrValid(val, O_PER_S));
	ASSERT(val == 0 || memIsDisjoint2(val, O_PER_S, der, count));
	// декодировать T
	t_count = derTDec(&t, der, count);
	if (t_count == SIZE_MAX || t != tag)
		return SIZE_MAX;
	der += t_count, count -= t_count;
	// декодировать L
	l_count = derLDec(&len, der, count);
	if (l_count == SIZE_MAX || len > O_PER_S + 1)
		return SIZE_MAX;
	der += l_count, count -= l_count;
	// декодировать V
	{
		register size_t v = 0;
		size_t pos = 0;
		// в старшем октете установлен старший бит?
		// избыточный нулевой старший октет?
		// переполнение?
		if ((der[0] & 0x80) ||
			der[0] == 0 && len > 1 && (der[1] & 0x80) == 0 ||
			len == O_PER_S + 1 && der[0] != 0)
			return SIZE_MAX;
		// декодировать
		for (; pos < len; ++pos)
			v <<= 8, v |= der[pos];
		if (val)
			*val = v;
		v = 0;
	}
	return t_count + l_count + len;
}